

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O3

DetectorResults *
ZXing::DataMatrix::Detect
          (DetectorResults *__return_storage_ptr__,BitMatrix *image,bool tryHarder,bool tryRotate,
          bool isPure)

{
  PointT<int> PVar1;
  _Rb_tree_node_base *p_Var2;
  undefined4 uVar3;
  undefined4 uVar5;
  _Base_ptr p_Var4;
  void *pvVar6;
  pointer puVar7;
  EdgeTracer *pEVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer pPVar11;
  ResultPoint *pRVar12;
  uint width_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined8 uVar17;
  pointer puVar18;
  BitMatrix *image_00;
  bool bVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  pointer *ppPVar23;
  undefined7 extraout_var;
  RegressionLine *pRVar24;
  mapped_type *pmVar25;
  _Rb_tree_node_base *p_Var26;
  _Base_ptr p_Var27;
  EdgeTracer *pEVar28;
  undefined4 uVar29;
  uint uVar30;
  undefined7 in_register_00000009;
  value_t_conflict *pvVar31;
  PointT<int> PVar32;
  undefined7 in_register_00000011;
  _Rb_tree_node_base *p_Var33;
  EdgeTracer *pEVar34;
  char cVar35;
  int iVar36;
  int iVar37;
  _Rb_tree_node_base *p_Var38;
  _Rb_tree_node_base *p_Var39;
  ResultPointsAndTransitions *pRVar40;
  undefined7 in_register_00000081;
  undefined8 uVar41;
  int iVar42;
  size_t __n;
  PointT<int> PVar43;
  uint uVar44;
  _Base_ptr p_Var45;
  long lVar46;
  RegressionLine *pRVar47;
  ResultPointsAndTransitions *pRVar48;
  _Base_ptr p_Var49;
  PointT<int> PVar50;
  _Base_ptr p_Var51;
  _Base_ptr p_Var52;
  float fVar53;
  float fVar54;
  double dVar55;
  double dVar56;
  _Base_ptr extraout_XMM0_Qb;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  double dVar57;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  undefined1 auVar66 [16];
  uint uVar68;
  uint uVar73;
  ulong uVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [12];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  double dVar89;
  _Base_ptr p_Var90;
  undefined1 auVar91 [16];
  PointF dEdge;
  PointF dir;
  PointF dEdge_00;
  PointF dir_00;
  PointF dEdge_01;
  PointF dir_01;
  PointF dEdge_02;
  PointF dEdge_03;
  PointF dir_02;
  PointF dEdge_04;
  PointT<double> PVar92;
  PointF a;
  PointF a_00;
  PointF a_01;
  PointF b1;
  PointF b1_00;
  PointF b2;
  PointF b2_00;
  PointF b2_01;
  PointF tr;
  PointF tl;
  int width;
  PointF br;
  PointF bl;
  int height;
  BitMatrixCursorI cur;
  ResultPoint pointA;
  int left;
  int top;
  array<ZXing::DataMatrix::DMRegressionLine,_4UL> lines;
  PointF local_448;
  undefined1 local_438 [24];
  pointer puStack_420;
  pointer local_418;
  ByteMatrix *pBStack_410;
  PointT<int> local_408;
  PointT<int> PStack_400;
  PointT<int> local_3f8;
  PointT<int> PStack_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [24];
  double dStack_3c0;
  undefined1 local_3b8 [16];
  _Rb_tree_node_base *local_3a8;
  PointT<double> PStack_3a0;
  ByteMatrix *pBStack_390;
  int local_388;
  undefined4 uStack_384;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  _Base_ptr local_368;
  _Base_ptr p_Stack_360;
  _Base_ptr local_358;
  _Base_ptr p_Stack_350;
  _Base_ptr local_348;
  _Base_ptr p_Stack_340;
  RegressionLine *local_330;
  PerspectiveTransform local_328;
  _Base_ptr local_2d8;
  _Base_ptr p_Stack_2d0;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  ulong local_2a0;
  double local_298;
  BitMatrix *local_290;
  EdgeTracer local_288;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  QuadrilateralF local_238;
  EdgeTracer local_1f8;
  QuadrilateralF local_1b8;
  double local_170;
  double local_168;
  ResultPoint *local_160;
  ResultPoint *local_158;
  pointer local_150;
  undefined1 local_148 [32];
  key_type pRStack_128;
  int local_120;
  undefined4 uStack_11c;
  undefined1 local_118 [24];
  ResultPointsAndTransitions local_100;
  double local_e0;
  double local_d8;
  double dStack_d0;
  RegressionLine local_c8;
  RegressionLine local_88;
  undefined1 local_48 [16];
  undefined8 extraout_XMM0_Qb_00;
  
  local_2b8 = (_Base_ptr)CONCAT44(local_2b8._4_4_,(int)CONCAT71(in_register_00000009,tryRotate));
  uVar41 = 8;
  bVar19 = BitMatrix::findBoundingBox
                     (image,(int *)&local_238,(int *)&local_1b8,(int *)(local_438 + 0x10),
                      (int *)local_3b8,8);
  local_2d8 = (_Base_ptr)CONCAT44(local_2d8._4_4_,(int)CONCAT71(in_register_00000081,isPure));
  if (bVar19) {
    local_328.a12 =
         (value_t)CONCAT44(local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_,
                           local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_);
    local_328.a13 = 2.12199579096527e-314;
    iVar36 = local_3b8._0_4_ + -1;
    iVar37 = 0;
    local_328.a11 = (value_t)image;
    do {
      iVar21 = iVar37;
      if (iVar36 == 0) break;
      iVar20 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                         ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_328,1,iVar36,false);
      iVar36 = iVar36 - iVar20;
      iVar37 = iVar21 + -1;
    } while (iVar20 != 0);
    if (iVar21 == 0) {
      local_328.a13 = (value_t)CONCAT44(-local_328.a13._0_4_,local_328.a13._4_4_);
      iVar36 = local_438._16_4_ + -1;
      iVar37 = 0;
      do {
        iVar21 = iVar37;
        if (iVar36 == 0) break;
        iVar20 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                           ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_328,1,iVar36,false);
        iVar36 = iVar36 - iVar20;
        iVar37 = iVar21 + -1;
      } while (iVar20 != 0);
      if (iVar21 == 0) {
        local_328.a13 = (value_t)CONCAT44(-local_328.a13._0_4_,local_328.a13._4_4_);
        iVar37 = local_3b8._0_4_ + -1;
        uVar68 = 0;
        do {
          uVar44 = uVar68;
          if (iVar37 == 0) break;
          iVar36 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                             ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_328,1,iVar37,false);
          iVar37 = iVar37 - iVar36;
          uVar68 = uVar44 + 1;
        } while (iVar36 != 0);
        local_328.a13 = (value_t)CONCAT44(-local_328.a13._0_4_,local_328.a13._4_4_);
        iVar37 = local_438._16_4_ + -1;
        uVar68 = 0;
        do {
          uVar73 = uVar68;
          if (iVar37 == 0) break;
          iVar36 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                             ((BitMatrixCursor<ZXing::PointT<int>_> *)&local_328,1,iVar37,false);
          iVar37 = iVar37 - iVar36;
          uVar68 = uVar73 + 1;
        } while (iVar36 != 0);
        if (((((uVar73 & 1) != 0) && (0xffffff76 < uVar44 - 0x90)) && ((uVar44 & 1) != 0)) &&
           (0xffffff78 < uVar73 - 0x90)) {
          fVar53 = (float)(int)local_438._16_4_ / (float)(int)(uVar73 + 1);
          fVar54 = (float)(int)local_3b8._0_4_ / (float)(int)(uVar44 + 1);
          if (ABS(fVar53 - fVar54) <= 1.0) {
            fVar67 = (fVar53 + fVar54) * 0.5;
            fVar83 = (float)(int)uVar73 * fVar67 +
                     fVar53 * 0.5 +
                     (float)local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
            if ((0.0 <= fVar83) && (fVar83 < (float)image->_width)) {
              fVar83 = (float)(int)uVar44 * fVar67 +
                       fVar54 * 0.5 +
                       (float)local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
              if ((0.0 <= fVar83) && (fVar83 < (float)image->_height)) {
                PVar50.x = local_438._16_4_ +
                           local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_ +
                           -1;
                iVar37 = local_3b8._0_4_ + -1 +
                         local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                Deflate((BitMatrix *)local_148,image,uVar73 + 1,uVar44 + 1,
                        fVar53 * 0.5 +
                        (float)local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_
                        ,fVar54 * 0.5 +
                         (float)local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x.
                                _0_4_,fVar67);
                PVar1.y = local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                PVar1.x = local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                PVar32.y = local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                PVar32.x = PVar50.x;
                PVar50.y = iVar37;
                PVar43.y = iVar37;
                PVar43.x = local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_;
                (__return_storage_ptr__->_bits)._width = local_148._0_4_;
                (__return_storage_ptr__->_bits)._height = local_148._4_4_;
                (__return_storage_ptr__->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_148._8_8_;
                (__return_storage_ptr__->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_148._16_8_;
                (__return_storage_ptr__->_bits)._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_148._24_8_;
                (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0]
                     = PVar1;
                (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1]
                     = PVar32;
                (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2]
                     = PVar50;
                (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3]
                     = PVar43;
                pRVar24 = (RegressionLine *)local_148._16_8_;
                pRVar47 = (RegressionLine *)local_148._8_8_;
                p_Var45 = local_2d8;
                goto LAB_00150984;
              }
            }
          }
        }
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (__return_storage_ptr__->_bits)._bits.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->_bits)._bits.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->_bits)._width = 0;
        (__return_storage_ptr__->_bits)._height = 0;
        (__return_storage_ptr__->_bits)._bits.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_148._24_8_ = (pointer)0x0;
        pRVar24 = (RegressionLine *)0x0;
        pRVar47 = (RegressionLine *)0x0;
        p_Var45 = local_2d8;
        goto LAB_00150984;
      }
    }
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148._24_8_ = (pointer)0x0;
    pRVar24 = (RegressionLine *)0x0;
    pRVar47 = (RegressionLine *)0x0;
    p_Var45 = local_2d8;
  }
  else {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148._24_8_ = (pointer)0x0;
    pRVar24 = (RegressionLine *)0x0;
    pRVar47 = (RegressionLine *)0x0;
    p_Var45 = (_Base_ptr)CONCAT71(in_register_00000081,isPure);
  }
LAB_00150984:
  cVar35 = (char)p_Var45;
  local_330 = pRVar24;
  if (pRVar47 == pRVar24 && cVar35 == '\0') {
    local_2c8._0_8_ = pRVar47;
    lVar46 = 0;
    local_150 = (pointer)local_148._24_8_;
    do {
      RegressionLine::RegressionLine((RegressionLine *)(local_148 + lVar46));
      lVar46 = lVar46 + 0x40;
    } while (lVar46 != 0x100);
    local_248._0_4_ = (int)CONCAT71(in_register_00000011,tryHarder);
    lVar46 = 0;
    do {
      local_288.history = (ByteMatrix *)0x0;
      local_288.state = 0;
      uVar29 = 0x193a38;
      dVar57 = *(double *)*(undefined1 (*) [16])(&DAT_00193a38 + lVar46);
      auVar87 = *(undefined1 (*) [16])(&DAT_00193a38 + lVar46);
      uVar3 = image->_width;
      uVar5 = image->_height;
      local_378._4_4_ = uVar5;
      local_378._0_4_ = uVar3;
      _fStack_370 = 0.0;
      local_348 = (_Base_ptr)
                  (dVar57 * 8.0 + ((double)((int)uVar3 / 2) - dVar57 * (double)((int)uVar3 / 2)));
      p_Stack_340 = (_Base_ptr)
                    (*(double *)(&UNK_00193a40 + lVar46) * 8.0 +
                    ((double)((int)uVar5 / 2) -
                    *(double *)(&UNK_00193a40 + lVar46) * (double)((int)uVar5 / 2)));
      local_288.super_BitMatrixCursorF.img = image;
      local_368 = (_Base_ptr)floor((double)local_348);
      p_Stack_360 = extraout_XMM0_Qb;
      dVar55 = floor((double)p_Stack_340);
      auVar58 = auVar87 & _DAT_001922a0;
      dVar57 = auVar58._8_8_;
      dVar56 = auVar58._0_8_;
      if (dVar57 <= dVar56) {
        dVar57 = dVar56;
      }
      auVar58._8_8_ = dVar57;
      auVar58._0_8_ = dVar57;
      local_288.super_BitMatrixCursorF.d = (PointT<double>)divpd(auVar87,auVar58);
      dVar57 = dVar55 + 0.5 + local_288.super_BitMatrixCursorF.d.x * 0.0;
      dVar55 = ((double)local_368 + 0.5) - local_288.super_BitMatrixCursorF.d.y * 0.0;
      local_288.super_BitMatrixCursorF.p.y = dVar57;
      local_288.super_BitMatrixCursorF.p.x = dVar55;
      if ((0.0 <= dVar55) &&
         (auVar87._8_8_ = -(ulong)(dVar57 < (double)local_378._4_4_),
         auVar87._0_8_ = -(ulong)(dVar55 < (double)local_378._0_4_),
         uVar29 = movmskpd(uVar29,auVar87),
         (byte)(0.0 <= dVar57 & (byte)uVar29 & (byte)uVar29 >> 1) != 0)) {
        bVar19 = EdgeTracer::moveToNextWhiteAfterBlack(&local_288);
        while (bVar19 != false) {
          local_438._0_16_ = ZEXT816(0);
          stack0xfffffffffffffc38 = (PointF)ZEXT816(0);
          local_3d8._0_16_ = ZEXT816(0);
          local_448 = (PointF)ZEXT816(0);
          lVar22 = 0;
          do {
            if (*(long *)(local_148 + lVar22 + 8) != *(long *)(local_148 + lVar22)) {
              *(long *)(local_148 + lVar22 + 8) = *(long *)(local_148 + lVar22);
            }
            *(undefined8 *)(local_148 + lVar22 + 0x18) = 0;
            *(undefined8 *)((long)&pRStack_128 + lVar22) = 0;
            *(undefined8 *)(local_118 + lVar22 + 8) = 0x7ff8000000000000;
            *(undefined8 *)((long)&local_120 + lVar22) = 0x7ff8000000000000;
            *(undefined8 *)(local_118 + lVar22) = 0x7ff8000000000000;
            lVar22 = lVar22 + 0x40;
          } while (lVar22 != 0x100);
          pBStack_390 = local_288.history;
          local_3a8 = (_Rb_tree_node_base *)local_288.super_BitMatrixCursorF.p.y;
          local_3b8._0_8_ = local_288.super_BitMatrixCursorF.img;
          local_3b8._8_8_ = local_288.super_BitMatrixCursorF.p.x;
          dEdge.y = (double)((ulong)local_288.super_BitMatrixCursorF.d.y ^ (ulong)DAT_001922b0);
          PStack_3a0.y = local_288.super_BitMatrixCursorF.d.x;
          PStack_3a0.x = dEdge.y;
          uStack_384 = local_288._52_4_;
          local_388 = 1;
          dEdge.x = (double)((ulong)local_288.super_BitMatrixCursorF.d.x ^ (ulong)DAT_001922b0);
          bVar19 = EdgeTracer::traceLine((EdgeTracer *)local_3b8,dEdge,(RegressionLine *)local_148);
          if (bVar19) {
            dir.x = -PStack_3a0.y;
            dir.y = PStack_3a0.x;
            bVar19 = EdgeTracer::traceCorner((EdgeTracer *)local_3b8,dir,(PointF *)local_438);
            if (bVar19) {
              pvVar31 = &((RegressionLine *)(local_148._8_8_ + -0x40))->b;
              pRVar24 = (RegressionLine *)local_148._0_8_;
              if ((ulong)local_148._0_8_ < pvVar31 && local_148._0_8_ != local_148._8_8_) {
                do {
                  ppPVar23 = &(pRVar24->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_328.a11 =
                       (value_t)(pRVar24->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  local_328.a12 =
                       (value_t)(pRVar24->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  pPVar11 = (pointer)pvVar31[1];
                  (pRVar24->_points).
                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)*pvVar31;
                  (pRVar24->_points).
                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pPVar11;
                  *pvVar31 = local_328.a11;
                  pvVar31[1] = local_328.a12;
                  pvVar31 = pvVar31 + -2;
                  pRVar24 = (RegressionLine *)ppPVar23;
                } while (ppPVar23 < pvVar31);
              }
              local_1f8.history = pBStack_390;
              local_1f8.super_BitMatrixCursorF.p.y = (double)local_3a8;
              local_1f8.super_BitMatrixCursorF.d = PStack_3a0;
              local_1f8.state = local_388;
              local_1f8._52_4_ = uStack_384;
              local_1f8.super_BitMatrixCursorF.img = (BitMatrix *)local_3b8._0_8_;
              local_1f8.super_BitMatrixCursorF.p.x = (double)local_3b8._8_8_;
              local_3a8 = (_Rb_tree_node_base *)local_288.super_BitMatrixCursorF.p.y;
              pBStack_390 = local_288.history;
              local_3b8._0_8_ = local_288.super_BitMatrixCursorF.img;
              local_3b8._8_8_ = local_288.super_BitMatrixCursorF.p.x;
              local_388 = 1;
              auVar59._0_8_ = (ulong)PStack_3a0.y ^ (ulong)DAT_001922b0;
              auVar59._8_8_ = PStack_3a0.x;
              dVar57 = ABS(PStack_3a0.x);
              if (ABS(PStack_3a0.x) <= ABS(PStack_3a0.y)) {
                dVar57 = ABS(PStack_3a0.y);
              }
              auVar76._8_8_ = dVar57;
              auVar76._0_8_ = dVar57;
              PStack_3a0 = (PointT<double>)divpd(auVar59,auVar76);
              dEdge_00.y = (double)((ulong)PStack_3a0.x ^ (ulong)DAT_001922b0);
              dEdge_00.x = PStack_3a0.y;
              bVar19 = EdgeTracer::traceLine
                                 ((EdgeTracer *)local_3b8,dEdge_00,(RegressionLine *)local_148);
              if (bVar19) {
                bVar19 = DMRegressionLine::truncateIfLShape((DMRegressionLine *)local_148);
                if (bVar19) {
                  local_3b8._8_8_ = ((RegressionLine *)(local_148._8_8_ + -0x40))->b;
                  local_3a8 = (_Rb_tree_node_base *)((RegressionLine *)(local_148._8_8_ + -0x40))->c
                  ;
                }
                EdgeTracer::updateDirectionFromOrigin
                          ((EdgeTracer *)local_3b8,(PointF)local_438._0_16_);
                dir_00.y = -PStack_3a0.x;
                uVar74 = (ulong)PStack_3a0.y ^ 0x8000000000000000;
                local_368 = (_Base_ptr)PStack_3a0.x;
                p_Stack_360 = (_Base_ptr)PStack_3a0.y;
                local_348 = (_Base_ptr)PStack_3a0.y;
                p_Stack_340 = (_Base_ptr)PStack_3a0.y;
                dir_00.x = PStack_3a0.y;
                bVar19 = EdgeTracer::traceCorner
                                   ((EdgeTracer *)local_3b8,dir_00,(PointF *)(local_3d8 + 0x10));
                if (bVar19) {
                  local_388 = 2;
                  dEdge_01.y = -PStack_3a0.x;
                  dEdge_01.x = PStack_3a0.y;
                  bVar19 = EdgeTracer::traceLine
                                     ((EdgeTracer *)local_3b8,dEdge_01,
                                      (RegressionLine *)(local_118 + 0x10));
                  if (bVar19) {
                    EdgeTracer::updateDirectionFromOrigin
                              ((EdgeTracer *)local_3b8,stack0xfffffffffffffc38);
                    dir_01.y = -PStack_3a0.x;
                    _local_378 = PStack_3a0;
                    dir_01.x = PStack_3a0.y;
                    bVar19 = EdgeTracer::traceCorner
                                       ((EdgeTracer *)local_3b8,dir_01,(PointF *)local_3d8);
                    if (bVar19) {
                      auVar69._8_8_ = local_3d8._0_8_;
                      auVar69._0_8_ = local_3d8._16_8_;
                      auVar77._0_8_ =
                           ((double)local_438._0_8_ - (double)local_3d8._16_8_) *
                           ((double)local_438._0_8_ - (double)local_3d8._16_8_) +
                           ((double)local_438._8_8_ - dStack_3c0) *
                           ((double)local_438._8_8_ - dStack_3c0);
                      auVar77._8_8_ =
                           ((double)local_3d8._16_8_ - (double)local_3d8._0_8_) *
                           ((double)local_3d8._16_8_ - (double)local_3d8._0_8_) +
                           (dStack_3c0 - (double)local_3d8._8_8_) *
                           (dStack_3c0 - (double)local_3d8._8_8_);
                      auVar87 = sqrtpd(auVar69,auVar77);
                      local_358 = (_Base_ptr)(auVar87._0_8_ + -1.0);
                      p_Stack_350 = (_Base_ptr)(auVar87._8_8_ + -1.0);
                      auVar60._8_8_ = -(ulong)((double)p_Stack_350 < 10.0);
                      auVar60._0_8_ = -(ulong)((double)local_358 < 8.0);
                      iVar37 = movmskpd((int)CONCAT71(extraout_var,bVar19),auVar60);
                      local_3e8._8_8_ = p_Stack_350;
                      local_3e8._0_8_ = p_Stack_350;
                      if ((((double)p_Stack_350 <= (double)local_358 * 18.0) &&
                          ((double)local_358 * 0.25 <= (double)p_Stack_350)) && (iVar37 == 0)) {
                        dVar57 = SUB168((undefined1  [16])_local_378 & _DAT_001922a0,8);
                        dVar55 = SUB168((undefined1  [16])_local_378 & _DAT_001922a0,0);
                        if (dVar57 <= dVar55) {
                          dVar57 = dVar55;
                        }
                        auVar70._8_8_ = dVar57;
                        auVar70._0_8_ = dVar57;
                        _local_378 = (PointT<double>)divpd((undefined1  [16])_local_378,auVar70);
                        local_1f8.super_BitMatrixCursorF.d = _local_378;
                        RegressionLine::RegressionLine((RegressionLine *)&local_328);
                        dEdge_02.y = local_378;
                        dEdge_02.x = -local_378._8_8_;
                        bVar19 = EdgeTracer::traceGaps
                                           (&local_1f8,dEdge_02,&local_88,
                                            (int)((double)local_3e8._0_8_ / 5.0 + 1.0),
                                            (RegressionLine *)&local_328,
                                            (double)local_3e8._0_8_ * 0.5);
                        if ((RegressionLine *)local_328.a11 != (RegressionLine *)0x0) {
                          operator_delete((void *)local_328.a11,
                                          (long)local_328.a13 - (long)local_328.a11);
                        }
                        if (bVar19) {
                          iVar37 = 0;
                          if (0x10 < (ulong)((long)local_88._points.
                                                                                                      
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_88._points.
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)) {
                            dVar57 = (local_88._points.
                                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->x -
                                     local_88._points.
                                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1].x;
                            dVar55 = (local_88._points.
                                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->y -
                                     local_88._points.
                                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1].y;
                            iVar37 = (int)SQRT(dVar57 * dVar57 + dVar55 * dVar55) / 3;
                          }
                          iVar36 = (int)((double)local_358 / 5.0);
                          if (iVar37 < (int)((double)local_358 / 5.0)) {
                            iVar36 = iVar37;
                          }
                          dVar57 = ABS((double)local_348);
                          if (ABS((double)local_348) <= ABS((double)local_368)) {
                            dVar57 = ABS((double)local_368);
                          }
                          auVar78._8_8_ = dVar57;
                          auVar78._0_8_ = dVar57;
                          auVar13._8_8_ = uVar74;
                          auVar13._0_8_ = dir_00.y;
                          PStack_3a0 = (PointT<double>)divpd(auVar13,auVar78);
                          local_388 = 3;
                          dEdge_03.y = -PStack_3a0.x;
                          dEdge_03.x = PStack_3a0.y;
                          bVar19 = EdgeTracer::traceGaps
                                             ((EdgeTracer *)local_3b8,dEdge_03,&local_c8,iVar36 * 2,
                                              &local_88,0.0);
                          if (bVar19) {
                            dir_02.y = -PStack_3a0.x;
                            dir_02.x = PStack_3a0.y;
                            bVar19 = EdgeTracer::traceCorner
                                               ((EdgeTracer *)local_3b8,dir_02,&local_448);
                            if (bVar19) {
                              if (ABS((SQRT(((double)local_438._0_8_ - local_448.x) *
                                            ((double)local_438._0_8_ - local_448.x) +
                                            ((double)local_438._8_8_ - local_448.y) *
                                            ((double)local_438._8_8_ - local_448.y)) + -1.0) -
                                      (double)local_3e8._0_8_) / (double)local_3e8._0_8_ < 0.5) {
                                if (((ABS((SQRT((local_448.x - (double)local_3d8._0_8_) *
                                                (local_448.x - (double)local_3d8._0_8_) +
                                                (local_448.y - (double)local_3d8._8_8_) *
                                                (local_448.y - (double)local_3d8._8_8_)) + -1.0) -
                                          (double)local_358) / (double)local_358 < 0.5) &&
                                    (0x40 < (ulong)((long)local_88._points.
                                                                                                                    
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_88._points.
                                                                                                                
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))) &&
                                   (0x40 < (ulong)((long)local_c8._points.
                                                                                                                  
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_c8._points.
                                                                                                                
                                                  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))) {
                                  dEdge_04.x = -local_1f8.super_BitMatrixCursorF.d.y;
                                  dEdge_04.y = local_1f8.super_BitMatrixCursorF.d.x;
                                  bVar19 = EdgeTracer::traceGaps
                                                     (&local_1f8,dEdge_04,&local_88,iVar36 * 2,
                                                      &local_c8,0.0);
                                  if (bVar19) {
                                    local_328.a11 = (value_t)local_148;
                                    local_328.a12 = (value_t)(local_118 + 0x10);
                                    local_328.a13 = (value_t)&local_88;
                                    local_328.a21 = (value_t)&local_c8;
                                    lVar22 = 0;
                                    do {
                                      RegressionLine::evaluate
                                                (*(RegressionLine **)((long)&local_328.a11 + lVar22)
                                                 ,1.0,false);
                                      lVar22 = lVar22 + 8;
                                    } while (lVar22 != 0x20);
                                    dVar57 = (double)CONCAT44(uStack_11c,local_120);
                                    auVar85._0_8_ =
                                         local_e0 * (double)local_118._0_8_ + dVar57 * -local_d8;
                                    auVar91._0_8_ =
                                         dStack_d0 * (double)local_118._0_8_ -
                                         (double)local_118._8_8_ * local_d8;
                                    auVar91._8_8_ =
                                         local_e0 * (double)local_118._8_8_ - dVar57 * dStack_d0;
                                    auVar85._8_8_ = auVar85._0_8_;
                                    register0x00001480 = (PointF)divpd(auVar91,auVar85);
                                    dVar55 = local_88.a * (double)local_118._0_8_ +
                                             dVar57 * -local_88.b;
                                    auVar61._0_8_ =
                                         (double)local_118._0_8_ * local_88.c -
                                         (double)local_118._8_8_ * local_88.b;
                                    auVar61._8_8_ =
                                         (double)local_118._8_8_ * local_88.a - dVar57 * local_88.c;
                                    auVar10._8_8_ = dVar55;
                                    auVar10._0_8_ = dVar55;
                                    local_438._0_16_ = divpd(auVar61,auVar10);
                                    dVar57 = local_88.a * local_c8.b + -local_88.b * local_c8.a;
                                    auVar79._0_8_ =
                                         local_88.c * local_c8.b - local_88.b * local_c8.c;
                                    auVar79._8_8_ =
                                         local_88.a * local_c8.c - local_88.c * local_c8.a;
                                    auVar9._8_8_ = dVar57;
                                    auVar9._0_8_ = dVar57;
                                    local_448 = (PointF)divpd(auVar79,auVar9);
                                    auVar71._0_8_ = local_e0 * local_c8.b + -local_d8 * local_c8.a;
                                    auVar82._0_8_ = dStack_d0 * local_c8.b - local_c8.c * local_d8;
                                    auVar82._8_8_ = local_e0 * local_c8.c - local_c8.a * dStack_d0;
                                    auVar71._8_8_ = auVar71._0_8_;
                                    local_3d8._0_16_ = divpd(auVar82,auVar71);
                                    dVar57 = DMRegressionLine::modules
                                                       ((DMRegressionLine *)&local_88,
                                                        (PointF)local_438._0_16_,local_448);
                                    pRVar24 = &local_c8;
                                    auVar62._0_8_ =
                                         DMRegressionLine::modules
                                                   ((DMRegressionLine *)pRVar24,
                                                    (PointF)local_3d8._0_16_,local_448);
                                    auVar62._8_8_ = dVar57;
                                    uVar44 = (uint)((ulong)(SUB168(auVar62 & _DAT_001922a0,0) +
                                                           -0x10000000000000) >> 0x20);
                                    uVar30 = (uint)((ulong)(SUB168(auVar62 & _DAT_001922a0,8) +
                                                           -0x10000000000000) >> 0x20);
                                    uVar68 = uVar44 ^ 0x80000000;
                                    uVar44 = uVar44 ^ 0x80000000;
                                    uVar73 = uVar30 ^ 0x80000000;
                                    uVar30 = uVar30 ^ 0x80000000;
                                    auVar75._0_4_ = -(uint)((int)uVar68 < -0x200000);
                                    auVar75._4_4_ = -(uint)((int)uVar44 < -0x200000);
                                    auVar75._8_4_ = -(uint)((int)uVar73 < -0x200000);
                                    local_48._12_4_ = -(uint)((int)uVar30 < -0x200000);
                                    local_48._0_12_ = auVar75;
                                    auVar72._0_4_ = -(uint)(-0x200001 < (int)uVar68);
                                    auVar72._4_4_ = -(uint)(-0x200001 < (int)uVar44);
                                    auVar72._8_4_ = -(uint)(-0x200001 < (int)uVar73);
                                    auVar72._12_4_ = -(uint)(-0x200001 < (int)uVar30);
                                    auVar63._0_8_ =
                                         (ulong)(auVar62._0_8_ - (double)(int)(auVar62._0_8_ + 0.5))
                                         & (ulong)DAT_001922a0;
                                    auVar63._8_8_ =
                                         (ulong)(dVar57 - (double)(int)(dVar57 + 0.5)) &
                                         DAT_001922a0._8_8_;
                                    uVar68 = (int)(dVar57 + 0.5) * 2;
                                    if ((auVar75 & (undefined1  [12])0x1) == (undefined1  [12])0x0)
                                    {
                                      uVar68 = 0;
                                    }
                                    uVar44 = (int)(auVar62._0_8_ + 0.5) * 2;
                                    if ((auVar75 & (undefined1  [12])0x1) == (undefined1  [12])0x0)
                                    {
                                      uVar44 = 0;
                                    }
                                    uVar30 = uVar68 - uVar44;
                                    uVar73 = -uVar30;
                                    if (0 < (int)uVar30) {
                                      uVar73 = uVar30;
                                    }
                                    auVar87 = auVar72 & _DAT_00193980 | ~auVar72 & auVar63;
                                    uVar30 = uVar68;
                                    if (auVar87._0_8_ < auVar87._8_8_) {
                                      uVar30 = uVar44;
                                    }
                                    width_00 = uVar30;
                                    if (9 < uVar73) {
                                      uVar30 = uVar44;
                                      width_00 = uVar68;
                                    }
                                    if ((width_00 - 10 < 0x87) && (uVar30 - 8 < 0x89)) {
                                      uVar17 = local_438._0_8_;
                                      local_368 = (_Base_ptr)local_438._8_8_;
                                      local_3e8._0_8_ = local_448.x;
                                      local_358 = (_Base_ptr)local_448.y;
                                      local_348 = (_Base_ptr)local_3d8._16_8_;
                                      local_378 = (undefined1  [8])dStack_3c0;
                                      local_2a0 = (ulong)uVar30;
                                      PVar92 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                               ::$_0::operator()((__0 *)pRVar24,
                                                                 (PointF)local_438._0_16_,local_448,
                                                                 stack0xfffffffffffffc38,0.5);
                                      local_160 = (ResultPoint *)PVar92.y;
                                      local_158 = (ResultPoint *)PVar92.x;
                                      local_290 = (BitMatrix *)local_3d8._0_8_;
                                      local_298 = (double)local_3d8._8_8_;
                                      a.y = (double)local_358;
                                      a.x = (double)local_3e8._0_8_;
                                      b2.y = (double)local_368;
                                      b2.x = (double)uVar17;
                                      PVar92 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                               ::$_0::operator()((__0 *)pRVar24,a,
                                                                 (PointF)local_3d8._0_16_,b2,0.3);
                                      local_170 = PVar92.y;
                                      local_168 = PVar92.x;
                                      a_00.y = local_298;
                                      a_00.x = (double)local_290;
                                      b1.y = (double)local_378;
                                      b1.x = (double)local_348;
                                      b2_00.y = (double)local_358;
                                      b2_00.x = (double)local_3e8._0_8_;
                                      PVar92 = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                               ::$_0::operator()((__0 *)pRVar24,a_00,b1,b2_00,0.5);
                                      local_358 = (_Base_ptr)PVar92.y;
                                      local_3e8._0_8_ = PVar92.x;
                                      a_01.y = (double)local_378;
                                      a_01.x = (double)local_348;
                                      b1_00.y = (double)local_368;
                                      b1_00.x = (double)uVar17;
                                      b2_01.y = local_298;
                                      b2_01.x = (double)local_290;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[3]
                                           = Scan(ZXing::DataMatrix::EdgeTracer&,std::array<ZXing::DataMatrix::DMRegressionLine,4ul>&)
                                             ::$_0::operator()((__0 *)pRVar24,a_01,b1_00,b2_01,0.5);
                                      image_00 = local_288.super_BitMatrixCursorF.img;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].
                                      x = (double)local_158;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].
                                      y = (double)local_160;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].
                                      x = local_168;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].
                                      y = local_170;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].
                                      x = (double)local_3e8._0_8_;
                                      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].
                                      y = (double)local_358;
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].
                                      x = (double)(int)width_00;
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].
                                      y = (double)(int)local_2a0;
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0]
                                           = (PointT<double>)ZEXT816(0);
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].
                                      y = 0.0;
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].
                                      x = 0.0;
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].
                                      x = local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                          [1].x;
                                      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].
                                      y = local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                          [2].y;
                                      PerspectiveTransform::PerspectiveTransform
                                                (&local_328,&local_1b8,&local_238);
                                      SampleGrid((DetectorResult *)(local_438 + 0x10),image_00,
                                                 width_00,(int)local_2a0,&local_328);
                                      puVar18 = local_418;
                                      puVar7 = puStack_420;
                                      if (puStack_420 != (pointer)0x0 && puStack_420 == local_418) {
                                        operator_delete(puStack_420,
                                                        (long)pBStack_410 - (long)puStack_420);
                                      }
                                      if (puVar7 != puVar18) {
                                        if (puStack_420 != local_418) goto LAB_0015190e;
                                        if (puStack_420 != (pointer)0x0) {
                                          operator_delete(puStack_420,
                                                          (long)pBStack_410 - (long)puStack_420);
                                        }
                                        goto LAB_001518ba;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          bVar19 = EdgeTracer::moveToNextWhiteAfterBlack(&local_288);
        }
        local_3f8.x = 0;
        local_3f8.y = 0;
        PStack_3f0.x = 0;
        PStack_3f0.y = 0;
        local_408.x = 0;
        local_408.y = 0;
        PStack_400.x = 0;
        PStack_400.y = 0;
        local_418 = (pointer)0x0;
        pBStack_410 = (ByteMatrix *)0x0;
        local_438._16_8_ = 0.0;
        puStack_420 = (pointer)0x0;
      }
LAB_001518ba:
    } while (((char)local_2b8 != '\0') && (lVar46 = lVar46 + 0x10, lVar46 != 0x40));
    local_3f8.x = 0;
    local_3f8.y = 0;
    PStack_3f0.x = 0;
    PStack_3f0.y = 0;
    local_408.x = 0;
    local_408.y = 0;
    PStack_400.x = 0;
    PStack_400.y = 0;
    local_418 = (pointer)0x0;
    pBStack_410 = (ByteMatrix *)0x0;
    local_438._16_8_ = 0.0;
    puStack_420 = (pointer)0x0;
LAB_0015190e:
    lVar46 = 0xc0;
    cVar35 = (char)local_2d8;
    uVar17 = local_2c8._0_8_;
    do {
      pvVar6 = *(void **)(local_148 + lVar46);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,*(long *)(local_148 + lVar46 + 0x10) - (long)pvVar6);
      }
      lVar46 = lVar46 + -0x40;
    } while (lVar46 != -0x40);
    (__return_storage_ptr__->_bits)._width = local_438._16_4_;
    (__return_storage_ptr__->_bits)._height = local_438._20_4_;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puStack_420;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = local_418;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pBStack_410;
    puStack_420 = (pointer)0x0;
    local_418 = (pointer)0x0;
    pBStack_410 = (ByteMatrix *)0x0;
    if (local_330 == (RegressionLine *)0x0) {
      auVar14._8_4_ = PStack_3f0.x;
      auVar14._12_4_ = PStack_3f0.y;
      auVar14._0_4_ = local_3f8.x;
      auVar14._4_4_ = local_3f8.y;
      *(undefined1 (*) [16])
       ((__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems + 2) =
           auVar14;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
           local_408;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
           PStack_400;
      tryHarder = (bool)local_248[0];
    }
    else {
      operator_delete((void *)uVar17,(long)local_150 - (long)local_330);
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
           local_3f8;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
           PStack_3f0;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
           local_408;
      (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
           PStack_400;
      tryHarder = (bool)local_248[0];
      if (puStack_420 != (pointer)0x0) {
        operator_delete(puStack_420,(long)pBStack_410 - (long)puStack_420);
      }
    }
    pRVar47 = (RegressionLine *)
              (__return_storage_ptr__->_bits)._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar24 = (RegressionLine *)
              (__return_storage_ptr__->_bits)._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if ((tryHarder != true || cVar35 != '\0') || pRVar47 != pRVar24) {
    return __return_storage_ptr__;
  }
  local_288.super_BitMatrixCursorF.img = (BitMatrix *)0x0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_288.super_BitMatrixCursorF.p.y;
  local_288.super_BitMatrixCursorF.p = (PointT<double>)(auVar15 << 0x40);
  local_438._0_16_ = ZEXT816(0);
  stack0xfffffffffffffc38 = (PointF)ZEXT816(0);
  pEVar28 = (EdgeTracer *)local_3d8;
  local_3d8._0_16_ = ZEXT816(0);
  bVar19 = DetectWhiteRect(image,(ResultPoint *)&local_288,(ResultPoint *)local_438,
                           (ResultPoint *)(local_3d8 + 0x10),(ResultPoint *)pEVar28);
  if (!bVar19) {
    puStack_420 = (pointer)0x0;
    local_418 = (pointer)0x0;
    local_3f8.x = 0;
    local_3f8.y = 0;
    PStack_3f0.x = 0;
    PStack_3f0.y = 0;
    local_408.x = 0;
    local_408.y = 0;
    PStack_400.x = 0;
    PStack_400.y = 0;
    local_438._16_8_ = 0.0;
    pBStack_410 = (ByteMatrix *)0x0;
    goto LAB_00151d0c;
  }
  TransitionsBetween((ResultPointsAndTransitions *)local_148,image,(ResultPoint *)&local_288,
                     (ResultPoint *)local_438);
  TransitionsBetween((ResultPointsAndTransitions *)(local_148 + 0x18),image,
                     (ResultPoint *)&local_288,(ResultPoint *)(local_3d8 + 0x10));
  TransitionsBetween((ResultPointsAndTransitions *)local_118,image,(ResultPoint *)local_438,
                     (ResultPoint *)local_3d8);
  TransitionsBetween(&local_100,image,(ResultPoint *)(local_3d8 + 0x10),(ResultPoint *)local_3d8);
  __n = 0x18;
  pRVar40 = (ResultPointsAndTransitions *)local_148;
  do {
    pRVar48 = (ResultPointsAndTransitions *)(local_148 + __n);
    iVar37 = pRVar40[1].transitions;
    if (iVar37 < (int)local_148._16_4_) {
      local_328.a13 = (value_t)*(RegressionLine **)(local_148 + __n + 0x10);
      local_328.a11 = (value_t)pRVar48->from;
      local_328.a12 = *(value_t *)(local_148 + __n + 8);
      memmove((void *)((long)pRVar40 + (0x30 - __n)),(ResultPointsAndTransitions *)local_148,__n);
      local_148._0_8_ = local_328.a11;
      local_148._8_8_ = local_328.a12;
      local_148._16_8_ = local_328.a13;
    }
    else {
      local_328.a11 = (value_t)pRVar48->from;
      local_328.a12 = *(value_t *)(local_148 + __n + 8);
      uVar29 = *(undefined4 *)&pRVar40[1].field_0x14;
      iVar36 = pRVar40->transitions;
      pRVar40 = pRVar48;
      while (iVar37 < iVar36) {
        uVar16 = *(undefined4 *)&pRVar40[-1].field_0x14;
        pRVar40->transitions = pRVar40[-1].transitions;
        *(undefined4 *)&pRVar40->field_0x14 = uVar16;
        pRVar12 = pRVar40[-1].to;
        pRVar40->from = pRVar40[-1].from;
        pRVar40->to = pRVar12;
        iVar36 = pRVar40[-2].transitions;
        pRVar40 = pRVar40 + -1;
      }
      pRVar40->from = (ResultPoint *)local_328.a11;
      pRVar40->to = (ResultPoint *)local_328.a12;
      pRVar40->transitions = iVar37;
      *(undefined4 *)&pRVar40->field_0x14 = uVar29;
    }
    __n = __n + 0x18;
    pRVar40 = pRVar48;
  } while (__n != 0x60);
  if (local_120 < 3) {
    p_Var2 = (_Rb_tree_node_base *)(local_3b8 + 8);
    local_3b8._8_8_ = local_3b8._8_8_ & 0xffffffff00000000;
    local_3a8 = (_Rb_tree_node_base *)0x0;
    PStack_3a0.y = (double)p_Var2;
    PStack_3a0.x = (double)p_Var2;
    pBStack_390 = (ByteMatrix *)0x0;
    pmVar25 = std::
              map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
              ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                            *)local_3b8,(key_type *)local_148);
    *pmVar25 = *pmVar25 + 1;
    pmVar25 = std::
              map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
              ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                            *)local_3b8,(key_type *)(local_148 + 8));
    *pmVar25 = *pmVar25 + 1;
    pmVar25 = std::
              map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
              ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                            *)local_3b8,(key_type *)(local_148 + 0x18));
    *pmVar25 = *pmVar25 + 1;
    pmVar25 = std::
              map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
              ::operator[]((map<const_ZXing::ResultPoint_*,_int,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                            *)local_3b8,&pRStack_128);
    *pmVar25 = *pmVar25 + 1;
    if ((_Rb_tree_node_base *)PStack_3a0.x == p_Var2) {
LAB_00151ccd:
      local_3f8.x = 0;
      local_3f8.y = 0;
      PStack_3f0.x = 0;
      PStack_3f0.y = 0;
      local_408.x = 0;
      local_408.y = 0;
      PStack_400.x = 0;
      PStack_400.y = 0;
      local_418 = (pointer)0x0;
      pBStack_410 = (ByteMatrix *)0x0;
      local_438._16_8_ = 0.0;
      puStack_420 = (pointer)0x0;
    }
    else {
      p_Var49 = (_Base_ptr)0x0;
      p_Var45 = (_Base_ptr)0x0;
      p_Var26 = (_Rb_tree_node_base *)PStack_3a0.x;
      p_Var52 = (_Base_ptr)0x0;
      do {
        if (*(int *)&p_Var26[1]._M_parent == 2) {
          p_Var45 = *(_Base_ptr *)(p_Var26 + 1);
          p_Var51 = p_Var52;
        }
        else {
          p_Var51 = *(_Base_ptr *)(p_Var26 + 1);
          if (p_Var49 == (_Base_ptr)0x0) {
            p_Var49 = p_Var51;
            p_Var51 = p_Var52;
          }
        }
        p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
        iVar37 = (int)uVar41;
        p_Var52 = p_Var51;
      } while (p_Var26 != p_Var2);
      if (p_Var51 == (_Base_ptr)0x0 || (p_Var45 == (_Base_ptr)0x0 || p_Var49 == (_Base_ptr)0x0))
      goto LAB_00151ccd;
      dVar56 = *(double *)p_Var49;
      p_Var52 = p_Var49->_M_parent;
      dVar55 = *(double *)p_Var45;
      p_Var27 = p_Var45->_M_parent;
      dVar57 = *(double *)p_Var51;
      p_Var4 = p_Var51->_M_parent;
      auVar86._0_8_ =
           (dVar55 - dVar57) * (dVar55 - dVar57) +
           ((double)p_Var27 - (double)p_Var4) * ((double)p_Var27 - (double)p_Var4);
      auVar86._8_8_ =
           (dVar56 - dVar55) * (dVar56 - dVar55) +
           ((double)p_Var52 - (double)p_Var27) * ((double)p_Var52 - (double)p_Var27);
      auVar87 = sqrtpd(auVar86,auVar86);
      dVar89 = SQRT((dVar56 - dVar57) * (dVar56 - dVar57) +
                    ((double)p_Var52 - (double)p_Var4) * ((double)p_Var52 - (double)p_Var4));
      dVar84 = auVar87._0_8_;
      if ((dVar84 < auVar87._8_8_) || (p_Var90 = p_Var52, dVar84 < dVar89)) {
        auVar88._8_8_ = -(ulong)(dVar89 < auVar87._8_8_);
        auVar88._0_8_ = -(ulong)(dVar89 < dVar84);
        iVar36 = movmskpd((int)CONCAT71((int7)((ulong)p_Var26 >> 8),
                                        p_Var51 == (_Base_ptr)0x0 ||
                                        (p_Var45 == (_Base_ptr)0x0 || p_Var49 == (_Base_ptr)0x0)),
                          auVar88);
        p_Var27 = p_Var45;
        dVar89 = dVar57;
        dVar84 = dVar55;
        if (iVar36 != 0) {
          p_Var27 = p_Var51;
          p_Var51 = p_Var45;
          dVar89 = dVar55;
          dVar84 = dVar57;
        }
        dVar57 = dVar89;
        p_Var4 = p_Var51->_M_parent;
        p_Var45 = p_Var49;
        p_Var49 = p_Var27;
        p_Var90 = p_Var27->_M_parent;
        p_Var27 = p_Var52;
        dVar55 = dVar56;
        dVar56 = dVar84;
      }
      local_368 = p_Var51;
      if (((float)(double)p_Var27 - (float)(double)p_Var90) * ((float)dVar57 - (float)dVar56) -
          ((float)dVar55 - (float)dVar56) * ((float)(double)p_Var4 - (float)(double)p_Var90) < 0.0)
      {
        local_368 = p_Var45;
        p_Var45 = p_Var51;
      }
      pEVar34 = &local_288;
      if (local_3a8 != (_Rb_tree_node_base *)0x0) {
        pEVar34 = &local_288;
        p_Var26 = p_Var2;
        p_Var39 = local_3a8;
        do {
          p_Var33 = p_Var39;
          p_Var38 = p_Var26;
          pEVar8 = *(EdgeTracer **)(p_Var33 + 1);
          p_Var26 = p_Var33;
          if (pEVar8 < pEVar34) {
            p_Var26 = p_Var38;
          }
          p_Var39 = (&p_Var33->_M_left)[pEVar8 < pEVar34];
        } while ((&p_Var33->_M_left)[pEVar8 < pEVar34] != (_Base_ptr)0x0);
        pEVar28 = (EdgeTracer *)0x0;
        if (p_Var26 != p_Var2) {
          if (pEVar8 < &local_288) {
            p_Var33 = p_Var38;
          }
          pEVar34 = &local_288;
          if (*(EdgeTracer **)(p_Var33 + 1) <= &local_288) {
            pEVar34 = (EdgeTracer *)local_438;
            p_Var26 = p_Var2;
            p_Var39 = local_3a8;
            do {
              p_Var33 = p_Var39;
              p_Var38 = p_Var26;
              pEVar8 = *(EdgeTracer **)(p_Var33 + 1);
              p_Var26 = p_Var33;
              if (pEVar8 < pEVar34) {
                p_Var26 = p_Var38;
              }
              p_Var39 = (&p_Var33->_M_left)[pEVar8 < pEVar34];
            } while ((&p_Var33->_M_left)[pEVar8 < pEVar34] != (_Base_ptr)0x0);
            pEVar28 = (EdgeTracer *)0x0;
            if (p_Var26 != p_Var2) {
              if (pEVar8 < (EdgeTracer *)local_438) {
                p_Var33 = p_Var38;
              }
              pEVar34 = (EdgeTracer *)local_438;
              if (*(EdgeTracer **)(p_Var33 + 1) <= (EdgeTracer *)local_438) {
                pEVar28 = (EdgeTracer *)(local_3d8 + 0x10);
                p_Var26 = local_3a8;
                p_Var39 = p_Var2;
                do {
                  p_Var38 = p_Var39;
                  p_Var33 = p_Var26;
                  pEVar34 = *(EdgeTracer **)(p_Var33 + 1);
                  p_Var39 = p_Var33;
                  if (pEVar34 < pEVar28) {
                    p_Var39 = p_Var38;
                  }
                  p_Var26 = (&p_Var33->_M_left)[pEVar34 < pEVar28];
                } while ((&p_Var33->_M_left)[pEVar34 < pEVar28] != (_Base_ptr)0x0);
                p_Var26 = p_Var2;
                if (p_Var39 != p_Var2) {
                  if (pEVar34 < pEVar28) {
                    p_Var33 = p_Var38;
                  }
                  p_Var26 = p_Var39;
                  if (pEVar28 < *(EdgeTracer **)(p_Var33 + 1)) {
                    p_Var26 = p_Var2;
                  }
                }
                pEVar34 = (EdgeTracer *)local_3d8;
                if (p_Var26 == p_Var2) {
                  pEVar34 = pEVar28;
                }
              }
            }
          }
        }
      }
      TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,(ResultPoint *)local_368,
                         (ResultPoint *)pEVar34);
      uVar68 = local_328.a13._0_4_;
      TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,(ResultPoint *)p_Var45,
                         (ResultPoint *)pEVar34);
      p_Var52 = local_368;
      if ((uVar68 - 0x8f) + (uVar68 & 1) < 0xffffff79) goto LAB_00151ccd;
      if ((local_328.a13._0_4_ - 0x8f) + (local_328.a13._0_4_ & 1) < 0xffffff77) goto LAB_00151ccd;
      uVar44 = (uVar68 & 1) + uVar68 + 2;
      uVar68 = (local_328.a13._0_4_ & 1) + 2 + local_328.a13._0_4_;
      local_448 = (PointF)ZEXT816(0);
      if ((SBORROW4(uVar44 * 4,uVar68 * 7) == (int)(uVar44 * 4 + uVar68 * -7) < 0) ||
         (SBORROW4(uVar68 * 4,uVar44 * 7) == (int)(uVar68 * 4 + uVar44 * -7) < 0)) {
        local_330 = (RegressionLine *)CONCAT44(local_330._4_4_,(float)(int)uVar44);
        local_3e8._0_8_ = *(double *)p_Var49;
        local_2b8 = p_Var49->_M_parent;
        local_348 = (_Base_ptr)(pEVar34->super_BitMatrixCursorF).img;
        local_358 = (_Base_ptr)(pEVar34->super_BitMatrixCursorF).p.x;
        local_2c8._0_8_ = *(undefined8 *)local_368;
        local_2d8 = local_368->_M_parent;
        p_Stack_350 = local_358;
        p_Stack_340 = local_358;
        p_Stack_2d0 = local_2d8;
        local_2c8._8_8_ = local_2d8;
        dVar57 = round(SQRT(((double)local_2c8._0_8_ - (double)local_348) *
                            ((double)local_2c8._0_8_ - (double)local_348) +
                            ((double)local_2d8 - (double)local_358) *
                            ((double)local_2d8 - (double)local_358)));
        auVar64._0_4_ = (float)dVar57;
        local_378._4_4_ = (float)(double)p_Stack_340;
        local_378._0_4_ = (float)(double)local_348;
        _fStack_370 = 0.0;
        auVar80._0_4_ = (float)(double)local_348 - (float)(double)local_2c8._0_8_;
        auVar80._4_4_ = (float)(double)p_Stack_340 - (float)(double)local_2c8._8_8_;
        auVar80._8_8_ = 0;
        auVar64._4_4_ = auVar64._0_4_;
        auVar64._8_4_ = auVar64._0_4_;
        auVar64._12_4_ = auVar64._0_4_;
        _local_248 = divps(auVar80,auVar64);
        auVar65._0_8_ =
             round(SQRT(((double)local_3e8._0_8_ - (double)local_2c8._0_8_) *
                        ((double)local_3e8._0_8_ - (double)local_2c8._0_8_) +
                        ((double)local_2b8 - (double)local_2d8) *
                        ((double)local_2b8 - (double)local_2d8)));
        auVar65._8_8_ = extraout_XMM0_Qb_00;
        local_2c8._4_12_ = auVar65._4_12_;
        local_2c8._0_4_ = (float)auVar65._0_8_ / (float)(int)uVar68;
        local_2d8 = *(_Base_ptr *)p_Var45;
        p_Stack_2d0 = p_Var45->_M_parent;
        dVar57 = (double)local_3e8._0_8_ - (double)local_2d8;
        local_3e8._8_8_ = p_Stack_2d0;
        local_3e8._0_8_ = p_Stack_2d0;
        dVar57 = round(SQRT(dVar57 * dVar57 +
                            ((double)local_2b8 - (double)p_Stack_2d0) *
                            ((double)local_2b8 - (double)p_Stack_2d0)));
        fVar53 = (float)dVar57 / local_330._0_4_;
        fVar54 = fVar53 * (float)local_248._0_4_ + (float)local_378._0_4_;
        fVar67 = fVar53 * (float)local_248._4_4_ + (float)local_378._4_4_;
        fStack_2b0 = fVar53 * fStack_240 + fStack_370;
        fStack_2ac = fVar53 * fStack_23c + fStack_36c;
        local_2b8 = (_Base_ptr)CONCAT44(fVar67,fVar54);
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = (double)fVar67;
        local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = (double)fVar54;
        dVar57 = round(SQRT(((double)local_2d8 - (double)local_348) *
                            ((double)local_2d8 - (double)local_348) +
                            ((double)local_3e8._0_8_ - (double)local_358) *
                            ((double)local_3e8._0_8_ - (double)local_358)));
        auVar66._0_4_ = (float)dVar57;
        auVar81._0_4_ = (float)local_378._0_4_ - (float)(double)local_2d8;
        auVar81._4_4_ = (float)local_378._4_4_ - (float)(double)p_Stack_2d0;
        auVar81._8_4_ = fStack_370 - 0.0;
        auVar81._12_4_ = fStack_36c - 0.0;
        auVar66._4_4_ = auVar66._0_4_;
        auVar66._8_4_ = auVar66._0_4_;
        auVar66._12_4_ = auVar66._0_4_;
        auVar87 = divps(auVar81,auVar66);
        fVar67 = (float)local_2c8._0_4_ * auVar87._0_4_ + (float)local_378._0_4_;
        fVar83 = (float)local_2c8._0_4_ * auVar87._4_4_ + (float)local_378._4_4_;
        local_1f8.super_BitMatrixCursorF.img = (BitMatrix *)(double)fVar67;
        local_1f8.super_BitMatrixCursorF.p.x = (double)(double)fVar83;
        fVar54 = (float)image->_width;
        fVar53 = (float)image->_height;
        if (((float)local_2b8 < 0.0) ||
           (((fVar54 <= (float)local_2b8 || (local_2b8._4_4_ <= 0.0)) || (fVar53 <= local_2b8._4_4_)
            ))) {
          if ((fVar83 < fVar53 && 0.0 < fVar83) && (fVar67 < fVar54 && 0.0 <= fVar67)) {
            pEVar28 = &local_1f8;
            goto LAB_00152756;
          }
          local_448.x = (double)(pEVar34->super_BitMatrixCursorF).img;
          local_448.y = (pEVar34->super_BitMatrixCursorF).p.x;
        }
        else {
          pEVar28 = (EdgeTracer *)&local_1b8;
          if ((fVar83 < fVar53 && 0.0 < fVar83) && (fVar67 < fVar54 && 0.0 <= fVar67)) {
            TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,(ResultPoint *)p_Var52
                               ,(ResultPoint *)&local_1b8);
            iVar36 = local_328.a13._0_4_;
            TransitionsBetween((ResultPointsAndTransitions *)&local_238,image,(ResultPoint *)p_Var45
                               ,(ResultPoint *)&local_1b8);
            iVar36 = uVar44 - iVar36;
            iVar37 = -iVar36;
            if (0 < iVar36) {
              iVar37 = iVar36;
            }
            iVar21 = uVar68 - local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_;
            iVar36 = -iVar21;
            if (0 < iVar21) {
              iVar36 = iVar21;
            }
            TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,
                               (ResultPoint *)local_368,(ResultPoint *)&local_1f8);
            iVar20 = local_328.a13._0_4_;
            TransitionsBetween((ResultPointsAndTransitions *)&local_238,image,(ResultPoint *)p_Var45
                               ,(ResultPoint *)&local_1f8);
            iVar20 = uVar44 - iVar20;
            iVar21 = -iVar20;
            if (0 < iVar20) {
              iVar21 = iVar20;
            }
            iVar42 = uVar68 - local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_;
            iVar20 = -iVar42;
            if (0 < iVar42) {
              iVar20 = iVar42;
            }
            pEVar28 = (EdgeTracer *)&local_1b8;
            p_Var52 = local_368;
            if ((uint)(iVar20 + iVar21) < (uint)(iVar36 + iVar37)) {
              pEVar28 = &local_1f8;
            }
          }
LAB_00152756:
          local_448.x = ((array<ZXing::PointT<double>,_4UL> *)&pEVar28->super_BitMatrixCursorF)->
                        _M_elems[0].x;
          local_448.y = ((array<ZXing::PointT<double>,_4UL> *)&pEVar28->super_BitMatrixCursorF)->
                        _M_elems[0].y;
        }
        TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,(ResultPoint *)p_Var52,
                           (ResultPoint *)&local_448);
        uVar68 = local_328.a13._0_4_;
        TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,(ResultPoint *)p_Var45,
                           (ResultPoint *)&local_448);
        iVar36 = (uVar68 & 1) + uVar68;
        iVar37 = (local_328.a13._0_4_ & 1) + local_328.a13._0_4_;
      }
      else {
        if ((int)uVar44 < (int)uVar68) {
          uVar68 = uVar44;
        }
        local_448 = (PointF)CorrectTopRight(image,(ResultPoint *)p_Var45,(ResultPoint *)local_368,
                                            (ResultPoint *)(ulong)uVar68,(ResultPoint *)pEVar28,
                                            iVar37);
        TransitionsBetween((ResultPointsAndTransitions *)&local_328,image,(ResultPoint *)p_Var52,
                           (ResultPoint *)&local_448);
        TransitionsBetween((ResultPointsAndTransitions *)&local_238,image,(ResultPoint *)p_Var45,
                           (ResultPoint *)&local_448);
        if ((int)local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_ <
            (int)local_328.a13._0_4_) {
          local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_ =
               local_328.a13._0_4_;
        }
        iVar36 = (local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x._0_4_ & 0xfffffffe
                 ) + 2;
        iVar37 = iVar36;
      }
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = (double)iVar36 + -0.5;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)iVar37 + -0.5;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0] = *(PointT<double> *)p_Var52;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = *(double *)p_Var45;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)p_Var45->_M_parent;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = *(double *)p_Var49;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = (double)p_Var49->_M_parent;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.5;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.5;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = 0.5;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
           local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = 0.5;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = local_448.x;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = local_448.y;
      local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x =
           local_238.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x;
      PerspectiveTransform::PerspectiveTransform(&local_328,&local_238,&local_1b8);
      SampleGrid((DetectorResult *)(local_438 + 0x10),image,iVar36,iVar37,&local_328);
    }
    std::
    _Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
    ::~_Rb_tree((_Rb_tree<const_ZXing::ResultPoint_*,_std::pair<const_ZXing::ResultPoint_*const,_int>,_std::_Select1st<std::pair<const_ZXing::ResultPoint_*const,_int>_>,_std::less<const_ZXing::ResultPoint_*>,_std::allocator<std::pair<const_ZXing::ResultPoint_*const,_int>_>_>
                 *)local_3b8);
  }
  else {
    puStack_420 = (pointer)0x0;
    local_418 = (pointer)0x0;
    local_3f8.x = 0;
    local_3f8.y = 0;
    PStack_3f0.x = 0;
    PStack_3f0.y = 0;
    local_408.x = 0;
    local_408.y = 0;
    PStack_400.x = 0;
    PStack_400.y = 0;
    local_438._16_8_ = 0.0;
    pBStack_410 = (ByteMatrix *)0x0;
  }
  pRVar47 = (RegressionLine *)
            (__return_storage_ptr__->_bits)._bits.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
LAB_00151d0c:
  (__return_storage_ptr__->_bits)._width = local_438._16_4_;
  (__return_storage_ptr__->_bits)._height = local_438._20_4_;
  puVar7 = (__return_storage_ptr__->_bits)._bits.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puStack_420;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_418;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pBStack_410;
  puStack_420 = (pointer)0x0;
  local_418 = (pointer)0x0;
  pBStack_410 = (ByteMatrix *)0x0;
  if (pRVar47 == (RegressionLine *)0x0) {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = local_3f8
    ;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
         PStack_3f0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = local_408
    ;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
         PStack_400;
  }
  else {
    operator_delete(pRVar47,(long)puVar7 - (long)pRVar47);
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = local_3f8
    ;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
         PStack_3f0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = local_408
    ;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
         PStack_400;
    if (puStack_420 != (pointer)0x0) {
      operator_delete(puStack_420,(long)pBStack_410 - (long)puStack_420);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DetectorResults Detect(const BitMatrix& image, bool tryHarder, bool tryRotate, bool isPure)
{
#ifdef __cpp_impl_coroutine
	// First try the very fast DetectPure() path. Also because DetectNew() generally fails with pure module size 1 symbols
	// TODO: implement a tryRotate version of DetectPure, see #590.
	if (auto r = DetectPure(image); r.isValid())
		co_yield std::move(r);
	else if (!isPure) { // If r.isValid() then there is no point in looking for more (no-pure) symbols
		bool found = false;
		for (auto&& r : DetectNew(image, tryHarder, tryRotate)) {
			found = true;
			co_yield std::move(r);
		}
		if (!found && tryHarder) {
			if (auto r = DetectOld(image); r.isValid())
				co_yield std::move(r);
		}
	}
#else
	auto result = DetectPure(image);
	if (!result.isValid() && !isPure)
		result = DetectNew(image, tryHarder, tryRotate);
	if (!result.isValid() && tryHarder && !isPure)
		result = DetectOld(image);
	return result;
#endif
}